

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O2

_Bool excp_is_internal(int excp)

{
  if ((3 < excp - 0x10000U) && ((0x10 < (uint)excp || ((0x10300U >> (excp & 0x1fU) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

static inline bool excp_is_internal(int excp)
{
    /* Return true if this exception number represents a QEMU-internal
     * exception that will not be passed to the guest.
     */
    return excp == EXCP_INTERRUPT
        || excp == EXCP_HLT
        || excp == EXCP_DEBUG
        || excp == EXCP_HALTED
        || excp == EXCP_EXCEPTION_EXIT
        || excp == EXCP_KERNEL_TRAP
        || excp == EXCP_SEMIHOST;
}